

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_setup_extension_permutation(SSL_HANDSHAKE *hs)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  uchar *__b;
  size_t local_b8;
  size_t i_1;
  size_t i;
  undefined1 local_98 [8];
  Array<unsigned_char> permutation;
  uint32_t seeds [27];
  SSL_HANDSHAKE *hs_local;
  
  if ((*(ushort *)&hs->config->field_0x10d >> 10 & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    Array<unsigned_char>::Array((Array<unsigned_char> *)local_98);
    iVar2 = RAND_bytes((uchar *)&permutation.size_,0x6c);
    if ((iVar2 == 0) ||
       (bVar1 = Array<unsigned_char>::InitForOverwrite((Array<unsigned_char> *)local_98,0x1c),
       !bVar1)) {
      hs_local._7_1_ = false;
    }
    else {
      for (i_1 = 0; i_1 < 0x1c; i_1 = i_1 + 1) {
        puVar3 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)local_98,i_1);
        *puVar3 = (uchar)i_1;
      }
      for (local_b8 = 0x1b; local_b8 != 0; local_b8 = local_b8 - 1) {
        puVar3 = Array<unsigned_char>::operator[]((Array<unsigned_char> *)local_98,local_b8);
        __b = Array<unsigned_char>::operator[]
                        ((Array<unsigned_char> *)local_98,
                         (ulong)seeds[local_b8 - 3] % (local_b8 + 1));
        std::swap<unsigned_char>(puVar3,__b);
      }
      Array<unsigned_char>::operator=(&hs->extension_permutation,(Array<unsigned_char> *)local_98);
      hs_local._7_1_ = true;
    }
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_98);
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_setup_extension_permutation(SSL_HANDSHAKE *hs) {
  if (!hs->config->permute_extensions) {
    return true;
  }

  static_assert(kNumExtensions <= UINT8_MAX,
                "extensions_permutation type is too small");
  uint32_t seeds[kNumExtensions - 1];
  Array<uint8_t> permutation;
  if (!RAND_bytes(reinterpret_cast<uint8_t *>(seeds), sizeof(seeds)) ||
      !permutation.InitForOverwrite(kNumExtensions)) {
    return false;
  }
  for (size_t i = 0; i < kNumExtensions; i++) {
    permutation[i] = i;
  }
  for (size_t i = kNumExtensions - 1; i > 0; i--) {
    // Set element |i| to a randomly-selected element 0 <= j <= i.
    std::swap(permutation[i], permutation[seeds[i - 1] % (i + 1)]);
  }
  hs->extension_permutation = std::move(permutation);
  return true;
}